

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_rect.cxx
# Opt level: O1

int clip_to_short(int *x,int *y,int *w,int *h)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar4 = 1;
  iVar3 = fl_line_width_;
  if (fl_line_width_ < 2) {
    iVar3 = 1;
  }
  iVar1 = *w;
  if ((0 < iVar1) && (0 < *h)) {
    iVar6 = -iVar3;
    iVar2 = *x;
    if ((SBORROW4(iVar2 + iVar1,iVar6) == iVar2 + iVar1 + iVar3 < 0) &&
       ((iVar5 = *h + *y, SBORROW4(iVar5,iVar6) == iVar5 + iVar3 < 0 &&
        (iVar5 = 0x7fff - iVar3, *y <= iVar5 && iVar2 <= iVar5)))) {
      if (SBORROW4(iVar2,iVar6) != iVar2 + iVar3 < 0) {
        *w = iVar1 + iVar3 + iVar2;
        *x = iVar6;
      }
      iVar4 = *y;
      if (SBORROW4(iVar4,iVar6) != iVar4 + iVar3 < 0) {
        *h = *h + iVar4 + iVar3;
        *y = iVar6;
      }
      if (iVar5 < *w + *x) {
        *w = iVar5 - *x;
      }
      iVar4 = 0;
      if (iVar5 < *h + *y) {
        *h = iVar5 - *y;
      }
    }
  }
  return iVar4;
}

Assistant:

static int clip_to_short(int &x, int &y, int &w, int &h) {

  int lw = (fl_line_width_ > 0) ? fl_line_width_ : 1;
  int kmin = -lw;
  int kmax = SHRT_MAX - lw;

  if (w <= 0 || h <= 0) return 1;		// (a)
  if (x+w < kmin || y+h < kmin) return 1;	// (b)
  if (x > kmax || y > kmax) return 1;		// (c)

  if (x < kmin) { w -= (kmin-x); x = kmin; }
  if (y < kmin) { h -= (kmin-y); y = kmin; }
  if (x+w > kmax) w = kmax - x;
  if (y+h > kmax) h = kmax - y;

  return 0;
}